

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

size_t gc_onestep(lua_State *L)

{
  GCSize *pGVar1;
  BloomFilter *pBVar2;
  size_t *psVar3;
  uint uVar4;
  GCSize GVar5;
  uint uVar6;
  uint uVar7;
  BloomFilter BVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  GCRef *pGVar12;
  size_t sVar13;
  size_t sVar14;
  GCstr *pGVar15;
  GCobj *pGVar16;
  ulong uVar17;
  GCstr *s;
  global_State *g;
  cTValue *o;
  undefined1 *puVar18;
  long lVar19;
  int local_48;
  
  uVar4 = (L->glref).ptr32;
  g = (global_State *)(ulong)uVar4;
  uVar11 = (ulong)(g->gc).state;
  psVar3 = (g->gc).state_count + uVar11;
  *psVar3 = *psVar3 + 1;
  switch(uVar11) {
  case 0:
    (g->gc).gray = 0;
    (g->gc).grayagain = 0;
    (g->gc).weak.gcptr32 = 0;
    pGVar16 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    if (((pGVar16->gch).marked & 3) != 0) {
      gc_mark(g,pGVar16);
      pGVar16 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    }
    if (((((GCobj *)(ulong)(uint)(pGVar16->pt).firstline)->gch).marked & 3) != 0) {
      gc_mark(g,(GCobj *)(ulong)(uint)(pGVar16->pt).firstline);
    }
    if (((g->registrytv).field_2.it + 0xd < 9) &&
       (pGVar16 = (GCobj *)(ulong)(g->registrytv).u32.lo, ((pGVar16->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar16);
    }
    gc_mark_gcroot(g);
    (g->gc).state = '\x01';
    break;
  case 1:
    if ((g->gc).gray.gcptr32 != 0) {
      sVar13 = propagatemark(g);
      return sVar13;
    }
    (g->gc).state = '\x02';
    break;
  case 2:
    if ((g->jit_base).ptr32 != 0) {
      return 0x7fffff00;
    }
    pGVar12 = &(g->uvhead).field_5.field_1.next;
    while (puVar18 = (undefined1 *)(ulong)pGVar12->gcptr32, &g->uvhead != (GCupval *)puVar18) {
      if ((((puVar18[4] & 7) == 0) && (((uint *)(ulong)*(uint *)(puVar18 + 0x10))[1] + 0xd < 9)) &&
         (pGVar16 = (GCobj *)(ulong)*(uint *)(ulong)*(uint *)(puVar18 + 0x10),
         ((pGVar16->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar16);
      }
      pGVar12 = (GCRef *)(puVar18 + 0xc);
    }
    gc_propagate_gray(g);
    (g->gc).gray.gcptr32 = (g->gc).weak.gcptr32;
    (g->gc).weak.gcptr32 = 0;
    if ((L->marked & 3) != 0) {
      gc_mark(g,(GCobj *)L);
    }
    gc_traverse_trace(g,(GCtrace *)(g + 1));
    gc_mark_gcroot(g);
    gc_propagate_gray(g);
    (g->gc).gray.gcptr32 = (g->gc).grayagain.gcptr32;
    (g->gc).grayagain.gcptr32 = 0;
    gc_propagate_gray(g);
    sVar13 = lj_gc_separateudata(g,0);
    uVar6 = (g->gc).mmudata.gcptr32;
    pGVar16 = (GCobj *)(ulong)uVar6;
    if (pGVar16 != (GCobj *)0x0) {
      do {
        uVar7 = (pGVar16->gch).nextgc.gcptr32;
        pGVar16 = (GCobj *)(ulong)uVar7;
        (pGVar16->gch).marked = (g->gc).currentwhite & 3 | (pGVar16->gch).marked & 0xf8;
        gc_mark(g,pGVar16);
      } while (uVar7 != uVar6);
    }
    sVar14 = gc_propagate_gray(g);
    pGVar12 = &(g->gc).weak;
    while (uVar11 = (ulong)pGVar12->gcptr32, uVar11 != 0) {
      if ((*(byte *)(uVar11 + 4) & 0x10) != 0) {
        uVar6 = *(uint *)(uVar11 + 0x18);
        for (lVar19 = 0; (ulong)uVar6 << 3 != lVar19; lVar19 = lVar19 + 8) {
          uVar7 = *(uint *)(uVar11 + 8);
          iVar10 = gc_mayclear((cTValue *)((ulong)uVar7 + lVar19),1);
          if (iVar10 != 0) {
            *(undefined4 *)((ulong)uVar7 + 4 + lVar19) = 0xffffffff;
          }
        }
      }
      uVar6 = *(uint *)(uVar11 + 0x1c);
      if (uVar6 != 0) {
        uVar7 = *(uint *)(uVar11 + 0x14);
        for (uVar17 = 0; (uint)uVar17 <= uVar6; uVar17 = (ulong)((uint)uVar17 + 1)) {
          if (*(int *)((ulong)uVar7 + 4 + uVar17 * 0x18) != -1) {
            o = (cTValue *)(uVar17 * 0x18 + (ulong)uVar7);
            iVar10 = gc_mayclear(o + 1,0);
            if ((iVar10 != 0) || (iVar10 = gc_mayclear(o,1), iVar10 != 0)) {
              (o->field_2).it = 0xffffffff;
            }
          }
        }
      }
      pGVar12 = (GCRef *)(uVar11 + 0xc);
    }
    local_48 = (int)sVar13;
    lj_buf_shrink(L,&g->tmpbuf);
    bVar9 = (g->gc).currentwhite ^ 3;
    (g->gc).currentwhite = bVar9;
    (g->strempty).marked = bVar9;
    (g->gc).sweep.ptr32 = uVar4 + 0x60;
    (g->gc).estimate = (g->gc).total - ((int)sVar14 + local_48);
    (g->gc).state = '\x03';
    (g->gc).sweepstr = 0;
    (g->strbloom).next[0] = 0;
    (g->strbloom).next[1] = 0;
    break;
  case 3:
    GVar5 = (g->gc).total;
    uVar4 = (g->gc).sweepstr;
    (g->gc).sweepstr = uVar4 + 1;
    bVar9 = (g->gc).currentwhite;
    pGVar15 = (GCstr *)(g->strhash + uVar4);
    while (s = (GCstr *)(ulong)(pGVar15->nextgc).gcptr32, s != (GCstr *)0x0) {
      if ((byte)((s->marked ^ 3) & (bVar9 ^ 3)) == 0) {
        (pGVar15->nextgc).gcptr32 = (s->nextgc).gcptr32;
        lj_str_free(g,s);
      }
      else {
        s->marked = (g->gc).currentwhite & 3 | s->marked & 0xf8;
        pGVar15 = s;
        if (0xbf < s->strflags) {
          pBVar2 = (g->strbloom).next;
          *pBVar2 = *pBVar2 | 1L << (byte)(s->hash >> 0x1a);
          pBVar2 = (g->strbloom).next + 1;
          *pBVar2 = *pBVar2 | 1L << (s->strflags & 0x3f);
        }
      }
    }
    if (g->strmask < (g->gc).sweepstr) {
      (g->gc).state = '\x04';
      BVar8 = (g->strbloom).next[1];
      (g->strbloom).cur[0] = (g->strbloom).next[0];
      (g->strbloom).cur[1] = BVar8;
    }
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar5);
    return 10;
  case 4:
    GVar5 = (g->gc).total;
    pGVar12 = gc_sweep(g,(GCRef *)(ulong)(g->gc).sweep.ptr32,0x28);
    (g->gc).sweep.ptr32 = (uint32_t)pGVar12;
    pGVar1 = &(g->gc).estimate;
    *pGVar1 = *pGVar1 + ((g->gc).total - GVar5);
    if (*(int *)((ulong)pGVar12 & 0xffffffff) != 0) {
      return 400;
    }
    uVar4 = g->strmask;
    if ((0x1ff < uVar4) && (g->strnum <= uVar4 >> 2)) {
      lj_str_resize(L,uVar4 >> 1);
    }
    if ((g->gc).mmudata.gcptr32 != 0) {
      (g->gc).state = '\x05';
      (g->gc).nocdatafin = '\x01';
      return 400;
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
    return 400;
  case 5:
    if ((g->gc).mmudata.gcptr32 != 0) {
      if ((g->jit_base).ptr32 != 0) {
        return 0x7fffff00;
      }
      gc_finalize(L);
      uVar4 = (g->gc).estimate;
      if (uVar4 < 0x65) {
        return 100;
      }
      (g->gc).estimate = uVar4 - 100;
      return 100;
    }
    if ((g->gc).nocdatafin == '\0') {
      lj_tab_rehash(L,(GCtab *)(ulong)g->gcroot[0x26].gcptr32);
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
  }
  return 0;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  g->gc.state_count[g->gc.state]++;
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (tvref(g->jit_base))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
#if LUAJIT_SMART_STRINGS
    g->strbloom.next[0] = 0;
    g->strbloom.next[1] = 0;
#endif
    return 0;
  case GCSsweepstring: {
    GCSize old = g->gc.total;
    gc_sweep_str_chain(g, &g->strhash[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->strmask) {
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
#if LUAJIT_SMART_STRINGS
      g->strbloom.cur[0] = g->strbloom.next[0];
      g->strbloom.cur[1] = g->strbloom.next[1];
#endif
    }
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    GCSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lj_assertG(old >= g->gc.total, "sweep increased memory");
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      if (g->strnum <= (g->strmask >> 2) && g->strmask > LJ_MIN_STRTAB*2-1)
	lj_str_resize(L, g->strmask >> 1);  /* Shrink string table. */
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (tvref(g->jit_base))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, tabref(g->gcroot[GCROOT_FFI_FIN]));
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lj_assertG(0, "bad GC state");
    return 0;
  }
}